

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

f32 irr::core::strtof10(char *in,char **out)

{
  bool bVar1;
  f32 floatValue;
  u32 intValue;
  u32 MAX_SAFE_U32_VALUE;
  char **out_local;
  char *in_local;
  f32 local_4;
  
  if (in == (char *)0x0) {
    if (out != (char **)0x0) {
      *out = (char *)0x0;
    }
    local_4 = 0.0;
  }
  else {
    intValue = 0;
    in_local = in;
    while( true ) {
      bVar1 = false;
      if ('/' < *in_local) {
        bVar1 = *in_local < ':';
      }
      if ((!bVar1) || (0x1999998e < intValue)) break;
      intValue = intValue * 10 + *in_local + -0x30;
      in_local = in_local + 1;
    }
    floatValue = (f32)(float)intValue;
    do {
      bVar1 = false;
      if ('/' < *in_local) {
        bVar1 = *in_local < ':';
      }
      if (!bVar1) break;
      floatValue = (f32)((float)floatValue * 10.0 + (float)(*in_local + -0x30));
      in_local = in_local + 1;
    } while ((float)floatValue <= 3.4028235e+38);
    if (out != (char **)0x0) {
      *out = in_local;
    }
    local_4 = floatValue;
  }
  return local_4;
}

Assistant:

inline f32 strtof10(const char *in, const char **out = 0)
{
	if (!in) {
		if (out)
			*out = in;
		return 0.f;
	}

	const u32 MAX_SAFE_U32_VALUE = UINT_MAX / 10 - 10;
	u32 intValue = 0;

	// Use integer arithmetic for as long as possible, for speed
	// and precision.
	while ((*in >= '0') && (*in <= '9')) {
		// If it looks like we're going to overflow, bail out
		// now and start using floating point.
		if (intValue >= MAX_SAFE_U32_VALUE)
			break;

		intValue = (intValue * 10) + (*in - '0');
		++in;
	}

	f32 floatValue = (f32)intValue;

	// If there are any digits left to parse, then we need to use
	// floating point arithmetic from here.
	while ((*in >= '0') && (*in <= '9')) {
		floatValue = (floatValue * 10.f) + (f32)(*in - '0');
		++in;
		if (floatValue > FLT_MAX) // Just give up.
			break;
	}

	if (out)
		*out = in;

	return floatValue;
}